

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBAnalyzer.cpp
# Opt level: O2

U64 __thiscall USBAnalyzer::SendPacketToHandler(USBAnalyzer *this,USBPacket *pckt)

{
  bool bVar1;
  uint uVar2;
  U64 UVar3;
  iterator iVar4;
  pair<std::_Rb_tree_iterator<std::pair<const_USBAnalyzer::USBPipe,_USBControlTransferPacketHandler>_>,_bool>
  pVar5;
  USBControlTransferPacketHandler UStack_1f8;
  pair<USBAnalyzer::USBPipe,_USBControlTransferPacketHandler> local_118;
  
  bVar1 = USBPacket::IsTokenPacket(pckt);
  if (bVar1) {
    (this->mCtrlTransLastPipe).addr =
         (pckt->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start[2] & 0x7f;
    uVar2 = *(ushort *)
             ((pckt->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish + -2) >> 7 & 0xf;
    (this->mCtrlTransLastPipe).endp = uVar2;
  }
  else {
    uVar2 = (this->mCtrlTransLastPipe).endp;
  }
  if (((uVar2 == 0) && (pckt->mPID != PID_PRE)) && (pckt->mPID != PID_SOF)) {
    iVar4 = std::
            _Rb_tree<USBAnalyzer::USBPipe,_std::pair<const_USBAnalyzer::USBPipe,_USBControlTransferPacketHandler>,_std::_Select1st<std::pair<const_USBAnalyzer::USBPipe,_USBControlTransferPacketHandler>_>,_std::less<USBAnalyzer::USBPipe>,_std::allocator<std::pair<const_USBAnalyzer::USBPipe,_USBControlTransferPacketHandler>_>_>
            ::find(&(this->mCtrlTransPacketHandlers)._M_t,&this->mCtrlTransLastPipe);
    if ((_Rb_tree_header *)iVar4._M_node ==
        &(this->mCtrlTransPacketHandlers)._M_t._M_impl.super__Rb_tree_header) {
      memset(&UStack_1f8,0,0xe0);
      USBControlTransferParser::USBControlTransferParser(&UStack_1f8.mCtrlTransParser);
      std::pair<USBAnalyzer::USBPipe,_USBControlTransferPacketHandler>::
      pair<USBAnalyzer::USBPipe_&,_USBControlTransferPacketHandler,_true>
                (&local_118,&this->mCtrlTransLastPipe,&UStack_1f8);
      pVar5 = std::
              _Rb_tree<USBAnalyzer::USBPipe,std::pair<USBAnalyzer::USBPipe_const,USBControlTransferPacketHandler>,std::_Select1st<std::pair<USBAnalyzer::USBPipe_const,USBControlTransferPacketHandler>>,std::less<USBAnalyzer::USBPipe>,std::allocator<std::pair<USBAnalyzer::USBPipe_const,USBControlTransferPacketHandler>>>
              ::_M_emplace_unique<std::pair<USBAnalyzer::USBPipe,USBControlTransferPacketHandler>>
                        ((_Rb_tree<USBAnalyzer::USBPipe,std::pair<USBAnalyzer::USBPipe_const,USBControlTransferPacketHandler>,std::_Select1st<std::pair<USBAnalyzer::USBPipe_const,USBControlTransferPacketHandler>>,std::less<USBAnalyzer::USBPipe>,std::allocator<std::pair<USBAnalyzer::USBPipe_const,USBControlTransferPacketHandler>>>
                          *)&this->mCtrlTransPacketHandlers,&local_118);
      iVar4._M_node = (_Base_ptr)pVar5.first._M_node;
      USBControlTransferParser::~USBControlTransferParser(&local_118.second.mCtrlTransParser);
      USBControlTransferParser::~USBControlTransferParser(&UStack_1f8.mCtrlTransParser);
      USBControlTransferPacketHandler::Init
                ((USBControlTransferPacketHandler *)&iVar4._M_node[1]._M_parent,
                 (this->mResults)._M_ptr,(this->mCtrlTransLastPipe).addr);
    }
    UVar3 = USBControlTransferPacketHandler::HandleControlTransfer
                      ((USBControlTransferPacketHandler *)&iVar4._M_node[1]._M_parent,pckt);
    return UVar3;
  }
  UVar3 = USBPacket::AddPacketFrames(pckt,(this->mResults)._M_ptr,FF_None);
  return UVar3;
}

Assistant:

U64 USBAnalyzer::SendPacketToHandler( USBPacket& pckt )
{
    if( pckt.IsTokenPacket() )
    {
        mCtrlTransLastPipe.addr = pckt.GetAddress();
        mCtrlTransLastPipe.endp = pckt.GetEndpoint();
    }

    // only control transfers and no SOF or PRE packets
    if( mCtrlTransLastPipe.endp == 0 && pckt.mPID != PID_SOF && pckt.mPID != PID_PRE )
    {
        // do we have this address/enpoint already?
        USBPipeHandler::iterator srch( mCtrlTransPacketHandlers.find( mCtrlTransLastPipe ) );

        // is this a new address?
        if( srch == mCtrlTransPacketHandlers.end() )
        {
            srch = mCtrlTransPacketHandlers.insert( std::make_pair( mCtrlTransLastPipe, USBControlTransferPacketHandler() ) ).first;
            srch->second.Init( mResults.get(), mCtrlTransLastPipe.addr );
        }

        return srch->second.HandleControlTransfer( pckt );
    }

    return pckt.AddPacketFrames( mResults.get() );
}